

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziparchive.cpp
# Opt level: O0

int __thiscall ZipArchive::close(ZipArchive *this,int __fd)

{
  uint8_t *puVar1;
  int iVar2;
  pointer puVar3;
  pointer puVar4;
  size_t sVar5;
  size_t in_RCX;
  unsigned_short *t;
  uint local_b8;
  unsigned_short local_b0;
  unsigned_short local_a8;
  unsigned_short local_86;
  uint local_84;
  uint local_80;
  unsigned_short local_7c;
  unsigned_short local_7a [3];
  uint local_74 [4];
  EndOfCentralDir64 local_61;
  byte local_29;
  size_t sStack_28;
  bool end64;
  size_t endCD;
  size_t sizeCD;
  size_t startCD;
  ZipArchive *this_local;
  
  startCD = (size_t)this;
  sizeCD = File::tell(&this->f);
  puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     (&this->entries);
  puVar1 = this->entryPtr;
  puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     (&this->entries);
  write(this,(int)puVar3,puVar1 + -(long)puVar4,in_RCX);
  sVar5 = File::tell(&this->f);
  endCD = sVar5 - sizeCD;
  sStack_28 = File::tell(&this->f);
  local_29 = this->force64 & 1;
  if ((local_29 == 0) && ((0xfffe < this->entryCount || (0xfffffffe < sizeCD)))) {
    local_29 = 1;
  }
  if (local_29 != 0) {
    local_61.id = 0x6064b50;
    local_61.size = 0x2c;
    local_61.v0 = 0x31e;
    local_61.v1 = 0x2d;
    local_61.disk = 0;
    local_61.cddisk = 0;
    local_61.diskentries = this->entryCount;
    local_61.entries = this->entryCount;
    local_61.cdsize = endCD;
    local_61.cdoffset = sizeCD;
    write<EndOfCentralDir64>(this,&local_61);
    local_74[3] = 0x7064b50;
    write<unsigned_int>(this,local_74 + 3);
    local_74[2] = 0;
    write<unsigned_int>(this,local_74 + 2);
    write<unsigned_long>(this,&stack0xffffffffffffffd8);
    local_74[1] = 1;
    write<unsigned_int>(this,local_74 + 1);
  }
  local_74[0] = 0x6054b50;
  write<unsigned_int>(this,local_74);
  local_7a[2] = 0;
  write<unsigned_short>(this,local_7a + 2);
  local_7a[1] = 0;
  write<unsigned_short>(this,local_7a + 1);
  if ((local_29 & 1) == 0) {
    local_a8 = (unsigned_short)this->entryCount;
  }
  else {
    local_a8 = 0xffff;
  }
  local_7a[0] = local_a8;
  write<unsigned_short>(this,local_7a);
  if ((local_29 & 1) == 0) {
    local_b0 = (unsigned_short)this->entryCount;
  }
  else {
    local_b0 = 0xffff;
  }
  local_7c = local_b0;
  write<unsigned_short>(this,&local_7c);
  local_80 = (uint)endCD;
  write<unsigned_int>(this,&local_80);
  if ((local_29 & 1) == 0) {
    local_b8 = (uint)sizeCD;
  }
  else {
    local_b8 = 0xffffffff;
  }
  local_84 = local_b8;
  write<unsigned_int>(this,&local_84);
  local_86 = 0;
  t = &local_86;
  write<unsigned_short>(this,t);
  iVar2 = File::close(&this->f,(int)t);
  return iVar2;
}

Assistant:

void ZipArchive::close()
{
    auto startCD = f.tell(); // tell_x(fp);

    write(entries.get(), entryPtr - entries.get());
    auto sizeCD = f.tell() - startCD;

    auto endCD = f.tell();

    bool end64 = force64;
    if (!end64) {
        if (entryCount > 0xfffe || startCD > 0xfffffffeL)
            end64 = true;
    }

    if (end64) {
        write<EndOfCentralDir64>({0x06064b50, 44, 0x031e, 45, 0, 0, entryCount,
                                  entryCount, (int64_t)sizeCD,
                                  (int64_t)startCD});
        // Locator
        write<uint32_t>(0x07064b50);
        write<uint32_t>(0);
        write<uint64_t>(endCD);
        write<uint32_t>(1);
    }
    write<uint32_t>(0x06054b50);
    write<uint16_t>(0);
    write<uint16_t>(0);
    write<uint16_t>(end64 ? 0xffff : entryCount);
    write<uint16_t>(end64 ? 0xffff : entryCount);
    write<uint32_t>(sizeCD);
    write<uint32_t>(end64 ? 0xffffffff : startCD);
    write<uint16_t>(0);

    f.close();
}